

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void cleanup_trap(void)

{
  long lVar1;
  ulong uVar2;
  
  if (z_info->trap_max != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      string_free(*(char **)(trap_info->flags + lVar1 + -0x68));
      mem_free(*(void **)(trap_info->flags + lVar1 + -0x60));
      string_free(*(char **)(trap_info->flags + lVar1 + -0x58));
      string_free(*(char **)(trap_info->flags + lVar1 + -0x50));
      string_free(*(char **)(trap_info->flags + lVar1 + -0x48));
      string_free(*(char **)(trap_info->flags + lVar1 + -0x40));
      string_free(*(char **)(trap_info->flags + lVar1 + -0x38));
      free_effect(*(effect **)(trap_info->save_flags + lVar1 + 0xd));
      free_effect(*(effect **)(trap_info->save_flags + lVar1 + 0x15));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x88;
    } while (uVar2 < z_info->trap_max);
  }
  mem_free(trap_info);
  return;
}

Assistant:

static void cleanup_trap(void)
{
	int i;
	for (i = 0; i < z_info->trap_max; i++) {
		string_free(trap_info[i].name);
		mem_free(trap_info[i].text);
		string_free(trap_info[i].desc);
		string_free(trap_info[i].msg);
		string_free(trap_info[i].msg_good);
		string_free(trap_info[i].msg_bad);
		string_free(trap_info[i].msg_xtra);
		free_effect(trap_info[i].effect);
		free_effect(trap_info[i].effect_xtra);
	}
	mem_free(trap_info);
}